

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling.cpp
# Opt level: O2

void Al::internal::profiling::prof_start(string name)

{
  return;
}

Assistant:

ProfileRange prof_start(std::string name) {
  (void) name;
  ProfileRange range;
#ifdef AL_HAS_NVPROF
  range.nvtx_range = nvtxRangeStartA(name.c_str());
#endif
#ifdef AL_HAS_ROCTRACER
  range.roctx_range = roctxRangeStart(name.c_str());
#endif
  return range;
}